

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QNameDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::QNameDatatypeValidator::checkContent
          (QNameDatatypeValidator *this,XMLCh *content,ValidationContext *context,bool asBase,
          MemoryManager *manager)

{
  MemoryManager *str1;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  DatatypeValidator *pDVar6;
  RegularExpression *this_00;
  InvalidDatatypeValueException *pIVar7;
  XMLCh *text2;
  RefArrayVectorOf<char16_t> *pRVar8;
  BaseRefVectorOf<char16_t> *pBVar9;
  XMLSize_t XVar10;
  char16_t *pcVar11;
  undefined4 extraout_var;
  undefined1 local_b0 [8];
  ArrayJanitor<char16_t> janEnum;
  XMLCh *normURI;
  bool foundURIId;
  XMLSize_t enumLength;
  XMLSize_t i;
  XMLCh *enumLocalName;
  XMLCh *enumPrefix;
  XMLCh *localName;
  ArrayJanitor<char16_t> jan;
  XMLCh *prefix;
  int colonPos;
  int thisFacetsDefined;
  QNameDatatypeValidator *pBaseValidator;
  MemoryManager *manager_local;
  bool asBase_local;
  ValidationContext *context_local;
  XMLCh *content_local;
  QNameDatatypeValidator *this_local;
  
  pDVar6 = DatatypeValidator::getBaseValidator((DatatypeValidator *)this);
  if (pDVar6 != (DatatypeValidator *)0x0) {
    (*(pDVar6->super_XSerializable)._vptr_XSerializable[0x14])(pDVar6,content,context,1,manager);
  }
  uVar3 = DatatypeValidator::getFacetsDefined((DatatypeValidator *)this);
  if ((uVar3 & 8) != 0) {
    this_00 = DatatypeValidator::getRegex((DatatypeValidator *)this);
    bVar1 = RegularExpression::matches(this_00,content,manager);
    if (!bVar1) {
      pIVar7 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
      text2 = DatatypeValidator::getPattern((DatatypeValidator *)this);
      InvalidDatatypeValueException::InvalidDatatypeValueException
                (pIVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/QNameDatatypeValidator.cpp"
                 ,0x6c,VALUE_NotMatch_Pattern,content,text2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      __cxa_throw(pIVar7,&InvalidDatatypeValueException::typeinfo,
                  InvalidDatatypeValueException::~InvalidDatatypeValueException);
    }
  }
  if (!asBase) {
    (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
      _vptr_XSerializable[0x11])(this,content,manager);
    prefix._0_4_ = 0;
    jan.fMemoryManager = (MemoryManager *)0x0;
    ArrayJanitor<char16_t>::ArrayJanitor
              ((ArrayJanitor<char16_t> *)&localName,(char16_t *)0x0,manager);
    if (context != (ValidationContext *)0x0) {
      jan.fMemoryManager = (MemoryManager *)XMLString::replicate(content,manager);
      ArrayJanitor<char16_t>::reset
                ((ArrayJanitor<char16_t> *)&localName,(char16_t *)jan.fMemoryManager,manager);
      (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
        _vptr_XSerializable[0x16])(this,jan.fMemoryManager,manager);
      prefix._0_4_ = XMLString::indexOf(content,L':');
      if (0 < (int)prefix) {
        *(undefined2 *)((long)&(jan.fMemoryManager)->_vptr_MemoryManager + (long)(int)prefix * 2) =
             0;
        uVar4 = (*context->_vptr_ValidationContext[0xd])(context,jan.fMemoryManager);
        if ((uVar4 & 1) != 0) {
          pIVar7 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
          InvalidDatatypeValueException::InvalidDatatypeValueException
                    (pIVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/QNameDatatypeValidator.cpp"
                     ,0x87,VALUE_QName_Invalid2,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                     manager);
          __cxa_throw(pIVar7,&InvalidDatatypeValueException::typeinfo,
                      InvalidDatatypeValueException::~InvalidDatatypeValueException);
        }
      }
    }
    if ((((uVar3 & 0x10) != 0) &&
        (pRVar8 = AbstractStringValidator::getEnumeration(&this->super_AbstractStringValidator),
        pRVar8 != (RefArrayVectorOf<char16_t> *)0x0)) && (context != (ValidationContext *)0x0)) {
      if ((int)prefix < 1) {
        enumPrefix = (XMLCh *)jan.fMemoryManager;
      }
      else {
        enumPrefix = (XMLCh *)((long)&(jan.fMemoryManager)->_vptr_MemoryManager +
                              (long)(int)prefix * 2 + 2);
      }
      enumLength = 0;
      pBVar9 = &AbstractStringValidator::getEnumeration(&this->super_AbstractStringValidator)->
                super_BaseRefVectorOf<char16_t>;
      XVar10 = BaseRefVectorOf<char16_t>::size(pBVar9);
      bVar1 = false;
      janEnum.fMemoryManager = (MemoryManager *)0x0;
      for (; enumLength < XVar10; enumLength = enumLength + 2) {
        pBVar9 = &AbstractStringValidator::getEnumeration(&this->super_AbstractStringValidator)->
                  super_BaseRefVectorOf<char16_t>;
        pcVar11 = BaseRefVectorOf<char16_t>::elementAt(pBVar9,enumLength);
        i = (XMLSize_t)XMLString::replicate(pcVar11,manager);
        ArrayJanitor<char16_t>::ArrayJanitor
                  ((ArrayJanitor<char16_t> *)local_b0,(char16_t *)i,manager);
        iVar5 = XMLString::indexOf((XMLCh *)i,L':',0,manager);
        if (iVar5 != -1) {
          *(XMLCh *)(i + (long)iVar5 * 2) = L'\0';
          i = (XMLSize_t)(i + ((long)iVar5 + 1) * 2);
        }
        bVar2 = XMLString::equals(enumPrefix,(XMLCh *)i);
        if (bVar2) {
          if (iVar5 < 0) {
            bVar2 = true;
          }
          else {
            if (!bVar1) {
              iVar5 = (*context->_vptr_ValidationContext[0xf])(context,jan.fMemoryManager);
              janEnum.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var,iVar5);
              bVar1 = true;
            }
            str1 = janEnum.fMemoryManager;
            pBVar9 = &AbstractStringValidator::getEnumeration(&this->super_AbstractStringValidator)
                      ->super_BaseRefVectorOf<char16_t>;
            pcVar11 = BaseRefVectorOf<char16_t>::elementAt(pBVar9,enumLength + 1);
            bVar2 = XMLString::equals((XMLCh *)str1,pcVar11);
            if (!bVar2) goto LAB_003ea9f3;
            bVar2 = true;
          }
        }
        else {
LAB_003ea9f3:
          bVar2 = false;
        }
        ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_b0);
        if (bVar2) break;
      }
      if (enumLength == XVar10) {
        pIVar7 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/QNameDatatypeValidator.cpp"
                   ,0xd2,VALUE_NotIn_Enumeration,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   manager);
        __cxa_throw(pIVar7,&InvalidDatatypeValueException::typeinfo,
                    InvalidDatatypeValueException::~InvalidDatatypeValueException);
      }
    }
    (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
      _vptr_XSerializable[0xf])(this,content,manager);
    ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&localName);
  }
  return;
}

Assistant:

void QNameDatatypeValidator::checkContent( const XMLCh*             const content
                                          ,       ValidationContext* const context
                                          ,       bool                     asBase
                                          ,       MemoryManager*     const manager
                                          )
{

    //validate against base validator if any
    QNameDatatypeValidator *pBaseValidator = (QNameDatatypeValidator*) this->getBaseValidator();
    if (pBaseValidator)
        pBaseValidator->checkContent(content, context, true, manager);

    int thisFacetsDefined = getFacetsDefined();

    // we check pattern first
    if ( (thisFacetsDefined & DatatypeValidator::FACET_PATTERN ) != 0 )
    {
        if (getRegex()->matches(content, manager) ==false)
        {
            ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_NotMatch_Pattern
                    , content
                    , getPattern()
                    , manager);
        }
    }

    // if this is a base validator, we only need to check pattern facet
    // all other facet were inherited by the derived type
    if (asBase)
        return;

    checkValueSpace(content, manager);

    int colonPos = 0;
    XMLCh* prefix = 0;    
    ArrayJanitor<XMLCh>  jan(prefix, manager);

    if (context) {
        prefix = XMLString::replicate(content, manager);
        jan.reset(prefix, manager);
        normalizeContent(prefix, manager);

        colonPos = XMLString::indexOf(content, chColon);
        if (colonPos > 0) {                        
            prefix[colonPos] = chNull;                     
            if (context->isPrefixUnknown(prefix)) {
                ThrowXMLwithMemMgr1(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_QName_Invalid2
                    , content
                    , manager);             
            }                                  
        }
    }

#if 0
    if ((thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0 &&
        (getEnumeration() != 0))
    {
        XMLCh* normContent = XMLString::replicate(content, manager);
        ArrayJanitor<XMLCh>  jan(normContent, manager);
        normalizeContent(normContent, manager);

        int i=0;
        int enumLength = getEnumeration()->size();
        for ( ; i < enumLength; i++)
        {
            if (XMLString::equals(normContent, getEnumeration()->elementAt(i)))
                break;
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }


#else
    if ((thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0 &&
        (getEnumeration() != 0) && context)
    {
        XMLCh* localName;
        if (colonPos > 0) {
            localName = prefix + colonPos + 1;
        }
        else {
            localName = prefix;
        }

        XMLCh* enumPrefix;
        XMLCh* enumLocalName;
        XMLSize_t i=0;
        XMLSize_t enumLength = getEnumeration()->size();
        bool foundURIId = false;
        const XMLCh* normURI = 0;
		// The +=2 is because the enumeration has prefix:localname as one entry followed
		// by the URI string for the prefix as the next entry.
        for ( ; i < enumLength; i+=2)
        {            
            enumPrefix = XMLString::replicate(getEnumeration()->elementAt(i), manager);
            ArrayJanitor<XMLCh>  janEnum(enumPrefix, manager);
            colonPos = XMLString::indexOf(enumPrefix, chColon, 0, manager);
            
            if (colonPos != -1) {
                enumLocalName = enumPrefix + colonPos + 1;
                enumPrefix[colonPos] = chNull;
            }
            else {
                enumLocalName = enumPrefix;
            }
            
            if (XMLString::equals(localName, enumLocalName)) {               
				if (colonPos < 0)
					break;

                // now need to see if the prefix URI's are the same                
                if (!foundURIId) {                    
                    normURI = context->getURIForPrefix(prefix);                                       
                    foundURIId = true;
                }
				if (XMLString::equals(normURI, getEnumeration()->elementAt(i+1)))
					break;
            }        
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }
#endif

    checkAdditionalFacet(content, manager);
}